

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O3

void __thiscall
helics::CallbackFederate::CallbackFederate(CallbackFederate *this,void **vtt,string *configString)

{
  _func_int **pp_Var1;
  FederateInfo FStack_1d8;
  
  loadFederateInfo(&FStack_1d8,(string *)configString);
  helics::CombinationFederate::CombinationFederate
            (&this->super_CombinationFederate,vtt + 1,(string_view)ZEXT816(0),&FStack_1d8);
  FederateInfo::~FederateInfo(&FStack_1d8);
  pp_Var1 = (_func_int **)*vtt;
  (this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate = pp_Var1;
  *(void **)((long)&(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate +
            (long)pp_Var1[-3]) = vtt[8];
  *(void **)&(this->super_CombinationFederate).super_ValueFederate.field_0x10 = vtt[9];
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x20 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x28 = 0;
  (this->super_CombinationFederate).super_ValueFederate.field_0x30 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x38 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x40 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x48 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x50 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x58 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x60 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x68 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x70 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x78 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x80 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x88 = 0;
  *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x90 = 0;
  loadOperator(this);
  return;
}

Assistant:

CallbackFederate::CallbackFederate(const std::string& configString):
    Federate(std::string_view{}, loadFederateInfo(configString)),
    CombinationFederate(std::string_view{}, loadFederateInfo(configString))
{
    loadOperator();
}